

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_val_t * art_iterator_erase(art_t *art,art_iterator_t *iterator)

{
  art_val_t *paVar1;
  art_inner_node_t *paVar2;
  _Bool _Var3;
  art_inner_node_t *new_child;
  art_key_chunk_t initial_key [6];
  undefined4 local_30;
  undefined2 local_2c;
  
  paVar1 = iterator->value;
  if (paVar1 != (art_val_t *)0x0) {
    local_2c = *(undefined2 *)(iterator->key + 4);
    local_30 = *(undefined4 *)iterator->key;
    _Var3 = art_iterator_up(iterator);
    if (_Var3) {
      paVar2 = (art_inner_node_t *)iterator->frames[iterator->frame].node;
      new_child = (art_inner_node_t *)
                  art_node_erase(paVar2,iterator->key
                                        [(ulong)paVar2->prefix_size + (ulong)iterator->depth]);
      if (new_child != paVar2) {
        iterator->frames[iterator->frame].node = (art_node_t *)new_child;
        _Var3 = art_iterator_up(iterator);
        if (_Var3) {
          paVar2 = (art_inner_node_t *)iterator->frames[iterator->frame].node;
          art_replace(paVar2,iterator->key[(ulong)paVar2->prefix_size + (ulong)iterator->depth],
                      (art_node_t *)new_child);
        }
        else {
          art->root = (art_node_t *)new_child;
        }
      }
      iterator->depth = '\0';
      iterator->frame = '\0';
      art_node_iterator_lower_bound(art->root,iterator,(art_key_chunk_t *)&local_30);
    }
    else {
      art->root = (art_node_t *)0x0;
      iterator->key[4] = '\0';
      iterator->key[5] = '\0';
      iterator->key[0] = '\0';
      iterator->key[1] = '\0';
      iterator->key[2] = '\0';
      iterator->key[3] = '\0';
      iterator->value = (art_val_t *)0x0;
    }
  }
  return paVar1;
}

Assistant:

art_val_t *art_iterator_erase(art_t *art, art_iterator_t *iterator) {
    if (iterator->value == NULL) {
        return NULL;
    }
    art_key_chunk_t initial_key[ART_KEY_BYTES];
    memcpy(initial_key, iterator->key, ART_KEY_BYTES);

    art_val_t *value_erased = iterator->value;
    bool went_up = art_iterator_up(iterator);
    if (!went_up) {
        // We're erasing the root.
        art->root = NULL;
        art_iterator_invalid_loc(iterator);
        return value_erased;
    }

    // Erase the leaf.
    art_inner_node_t *parent_node =
        (art_inner_node_t *)art_iterator_node(iterator);
    art_key_chunk_t key_chunk_in_parent =
        iterator->key[iterator->depth + parent_node->prefix_size];
    art_node_t *new_parent_node =
        art_node_erase(parent_node, key_chunk_in_parent);

    if (new_parent_node != ((art_node_t *)parent_node)) {
        // Replace the pointer to the inner node we erased from in its
        // parent (it may be a leaf now).
        iterator->frames[iterator->frame].node = new_parent_node;
        went_up = art_iterator_up(iterator);
        if (went_up) {
            art_inner_node_t *grandparent_node =
                (art_inner_node_t *)art_iterator_node(iterator);
            art_key_chunk_t key_chunk_in_grandparent =
                iterator->key[iterator->depth + grandparent_node->prefix_size];
            art_replace(grandparent_node, key_chunk_in_grandparent,
                        new_parent_node);
        } else {
            // We were already at the rootmost node.
            art->root = new_parent_node;
        }
    }

    iterator->frame = 0;
    iterator->depth = 0;
    // Do a lower bound search for the initial key, which will find the first
    // greater key if it exists. This can likely be mildly faster if we instead
    // start from the current position.
    art_node_iterator_lower_bound(art->root, iterator, initial_key);
    return value_erased;
}